

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::set_external_address
          (session_impl *this,shared_ptr<libtorrent::aux::listen_socket_t> *sock,address *ip,
          ip_source_t source_type,address *source)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  size_type sVar3;
  pointer psVar4;
  dht_tracker *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Alloc_hider _Var5;
  bool bVar6;
  _Atomic_word _Var7;
  address *ep;
  address *extraout_RDX;
  address *addr;
  address *addr_00;
  string *__return_storage_ptr__;
  shared_ptr<libtorrent::aux::torrent> *t;
  pointer psVar8;
  string local_98;
  pointer local_78;
  string local_70;
  string local_50;
  
  bVar6 = ip_voter::cast_vote(&((sock->
                                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->external_address,ip,source_type,source);
  if (bVar6) {
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
      peVar2 = (sock->
               super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      sVar3 = (peVar2->device)._M_string_length;
      if (sVar3 == 0) {
        __return_storage_ptr__ = &local_70;
        print_endpoint_abi_cxx11_
                  (__return_storage_ptr__,(aux *)&peVar2->local_endpoint,(endpoint *)ep);
        addr = extraout_RDX;
      }
      else {
        __return_storage_ptr__ = &peVar2->device;
        addr = ep;
      }
      local_78 = (__return_storage_ptr__->_M_dataplus)._M_p;
      print_address_abi_cxx11_(&local_98,(aux *)ip,addr);
      _Var5._M_p = local_98._M_dataplus._M_p;
      print_address_abi_cxx11_(&local_50,(aux *)source,addr_00);
      session_log(this,"external address updated for %s [ new-ip: %s type: %d last-voter: %s ]",
                  local_78,_Var5._M_p,(ulong)source_type.m_val,local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((sVar3 == 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2)) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if (((this->m_alerts).m_alert_mask._M_i.m_val & 0x40) != 0) {
      alert_manager::emplace_alert<libtorrent::external_ip_alert,boost::asio::ip::address_const&>
                (&this->m_alerts,ip);
    }
    psVar4 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar8 = (this->m_torrents).m_array.
                  super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar4; psVar8 = psVar8 + 1)
    {
      torrent::new_external_ip
                ((psVar8->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
    }
    this_00 = (this->m_dht).
              super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (dht_tracker *)0x0) {
      local_98._M_dataplus._M_p =
           (pointer)(sock->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
      this_01 = (sock->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_weak_count = this_01->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_weak_count = this_01->_M_weak_count + 1;
        }
      }
      local_98._M_string_length = (size_type)this_01;
      libtorrent::dht::dht_tracker::update_node_id(this_00,(listen_socket_handle *)&local_98);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_98._M_string_length + 0xc);
          _Var7 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          _Var7 = *(_Atomic_word *)(local_98._M_string_length + 0xc);
          *(_Atomic_word *)(local_98._M_string_length + 0xc) = _Var7 + -1;
        }
        if (_Var7 == 1) {
          (*(*(_func_int ***)local_98._M_string_length)[3])();
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
  }
  return;
}

Assistant:

void session_impl::set_external_address(std::shared_ptr<listen_socket_t> const& sock
		, address const& ip, ip_source_t const source_type, address const& source)
	{
		if (!sock->external_address.cast_vote(ip, source_type, source)) return;

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("external address updated for %s [ new-ip: %s type: %d last-voter: %s ]"
				, sock->device.empty() ? print_endpoint(sock->local_endpoint).c_str() : sock->device.c_str()
				, print_address(ip).c_str()
				, static_cast<std::uint8_t>(source_type)
				, print_address(source).c_str());
		}
#endif

		if (m_alerts.should_post<external_ip_alert>())
			m_alerts.emplace_alert<external_ip_alert>(ip);

		for (auto const& t : m_torrents)
		{
			t->new_external_ip();
		}

		// since we have a new external IP now, we need to
		// restart the DHT with a new node ID

#ifndef TORRENT_DISABLE_DHT
		if (m_dht) m_dht->update_node_id(sock);
#endif
	}